

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::MeshLoader::loadTexCoordsSourceElement(MeshLoader *this,InputShared *input)

{
  Semantic SVar1;
  ulong uVar2;
  Semantic *pSVar3;
  ulong uVar4;
  bool bVar5;
  SourceBase *sourceBase;
  String *pSVar6;
  ostream *poVar7;
  ulong uVar8;
  MeshLoader *this_00;
  URI *copyFrom_;
  Semantic semantic;
  String sourceId;
  URI inputUrl;
  Semantic local_13c;
  String local_138;
  URI local_118;
  
  SVar1 = (input->super_InputUnshared).mSemantic;
  local_13c = SVar1;
  if ((SVar1 != TEXCOORD) && (SVar1 != UV)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"The current input element is not a UV / TEXCOORD element!",
               0x39);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    return false;
  }
  copyFrom_ = &(input->super_InputUnshared).mSource;
  COLLADABU::URI::URI(&local_118,copyFrom_,false);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,local_118.mFragment._M_dataplus._M_p,
             local_118.mFragment._M_dataplus._M_p + local_118.mFragment._M_string_length);
  this_00 = this;
  sourceBase = SourceArrayLoader::getSourceById(&this->super_SourceArrayLoader,&local_138);
  if (sourceBase != (SourceBase *)0x0) {
    uVar2 = (sourceBase->mLoadedInputElements).mCount;
    if (uVar2 == 0) {
LAB_00804aed:
      if (sourceBase->mStride - 5 < 0xfffffffffffffffd) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"The uv source ",0xe);
        pSVar6 = COLLADABU::URI::getURIString_abi_cxx11_(copyFrom_);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(pSVar6->_M_dataplus)._M_p,
                            pSVar6->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," has a wrong dimension of ",0x1a)
        ;
        poVar7 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,". Dimensions between 2 and 4 are allowed. ",0x2a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        bVar5 = false;
      }
      else {
        bVar5 = appendVertexValues(this_00,sourceBase,&this->mMesh->mUVCoords);
      }
      SourceBase::addLoadedInputElement(sourceBase,&local_13c);
      goto LAB_00804bba;
    }
    pSVar3 = (sourceBase->mLoadedInputElements).mData;
    if (*pSVar3 != SVar1) {
      uVar4 = 1;
      do {
        uVar8 = uVar4;
        if (uVar2 == uVar8) break;
        uVar4 = uVar8 + 1;
      } while (pSVar3[uVar8] != SVar1);
      if (uVar2 <= uVar8) goto LAB_00804aed;
    }
  }
  bVar5 = false;
LAB_00804bba:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  COLLADABU::URI::~URI(&local_118);
  return bVar5;
}

Assistant:

bool MeshLoader::loadTexCoordsSourceElement ( const InputShared& input )
    {
        bool retValue = true;

        // Get the semantic of the current input element.
        InputSemantic::Semantic semantic = input.getSemantic ();
        if ( semantic != InputSemantic::UV && semantic != InputSemantic::TEXCOORD )
        {
            std::cerr << "The current input element is not a UV / TEXCOORD element!" << std::endl;
            return false;
        }

        // Get the source element with the uri of the input element.
        COLLADABU::URI inputUrl = input.getSource ();
        String sourceId = inputUrl.getFragment ();
        SourceBase* sourceBase = getSourceById ( sourceId );
        if ( sourceBase == 0 ) return false;

        // Check if the source element is already loaded.
        if ( sourceBase->isLoadedInputElement ( semantic ) ) return false;

        // Get the stride of the uv coordinates. 
        // This is the dimension of the uv coordinates.
        // In depend on the dimension, we store the coordinates in the mesh.
        unsigned long long stride = sourceBase->getStride ();
        if ( stride < 2 || stride > 4 )
        {
            std::cerr << "The uv source " <<  input.getSource().getURIString () 
                << " has a wrong dimension of " << stride 
                << ". Dimensions between 2 and 4 are allowed. " << std::endl;
            retValue = false;
        }
        else
        {
            COLLADAFW::MeshVertexData& uvCoords = mMesh->getUVCoords ();
            retValue = appendVertexValues ( sourceBase, uvCoords );
        }

        // Set the source base as loaded element.
        sourceBase->addLoadedInputElement ( semantic );

        return retValue;
    }